

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O1

void __thiscall
spvtools::disassemble::InstructionDisassembler::EmitSectionComment
          (InstructionDisassembler *this,spv_parsed_instruction_t *inst,
          bool *inserted_decoration_space,bool *inserted_debug_space,bool *inserted_type_space)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  char cVar3;
  bool bVar4;
  int32_t iVar5;
  ostream *poVar6;
  Op opcode;
  uint32_t local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  bool *local_40;
  bool *local_38;
  
  uVar2 = inst->opcode;
  if (uVar2 == 0x36 && this->comment_ != 0) {
    cVar3 = (char)this->stream_;
    local_40 = inserted_decoration_space;
    local_38 = inserted_type_space;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->stream_ + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    if (this->nested_indent_ == true) {
      cVar3 = (char)this->stream_;
      std::ios::widen((char)*(undefined8 *)(*(long *)this->stream_ + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    poVar6 = this->stream_;
    paVar1 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indent_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_60._M_dataplus._M_p,local_60._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    poVar6 = this->stream_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; Function ",0xb);
    local_64 = inst->result_id;
    if ((this->name_mapper_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->name_mapper_)._M_invoker)(&local_60,(_Any_data *)&this->name_mapper_,&local_64);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    inserted_decoration_space = local_40;
    inserted_type_space = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      inserted_decoration_space = local_40;
      inserted_type_space = local_38;
    }
  }
  opcode = (Op)uVar2;
  if (((this->comment_ != 0) && (*inserted_decoration_space == false)) &&
     (bVar4 = spvOpcodeIsDecoration(opcode), bVar4)) {
    *inserted_decoration_space = true;
    cVar3 = (char)this->stream_;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->stream_ + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    poVar6 = this->stream_;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indent_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_60._M_dataplus._M_p,local_60._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    poVar6 = this->stream_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; Annotations",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  if (((this->comment_ != 0) && (*inserted_debug_space == false)) &&
     (bVar4 = spvOpcodeIsDebug(opcode), bVar4)) {
    *inserted_debug_space = true;
    cVar3 = (char)this->stream_;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->stream_ + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    poVar6 = this->stream_;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indent_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_60._M_dataplus._M_p,local_60._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    poVar6 = this->stream_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; Debug Information",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  if (((this->comment_ != 0) && (*inserted_type_space == false)) &&
     (iVar5 = spvOpcodeGeneratesType(opcode), iVar5 != 0)) {
    *inserted_type_space = true;
    cVar3 = (char)this->stream_;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->stream_ + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    poVar6 = this->stream_;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indent_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_60._M_dataplus._M_p,local_60._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    poVar6 = this->stream_;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"; Types, variables and constants",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  return;
}

Assistant:

void InstructionDisassembler::EmitSectionComment(
    const spv_parsed_instruction_t& inst, bool& inserted_decoration_space,
    bool& inserted_debug_space, bool& inserted_type_space) {
  auto opcode = static_cast<spv::Op>(inst.opcode);
  if (comment_ && opcode == spv::Op::OpFunction) {
    stream_ << std::endl;
    if (nested_indent_) {
      // Double the empty lines between Function sections since nested_indent_
      // also separates blocks by a blank.
      stream_ << std::endl;
    }
    stream_ << std::string(indent_, ' ');
    stream_ << "; Function " << name_mapper_(inst.result_id) << std::endl;
  }
  if (comment_ && !inserted_decoration_space && spvOpcodeIsDecoration(opcode)) {
    inserted_decoration_space = true;
    stream_ << std::endl;
    stream_ << std::string(indent_, ' ');
    stream_ << "; Annotations" << std::endl;
  }
  if (comment_ && !inserted_debug_space && spvOpcodeIsDebug(opcode)) {
    inserted_debug_space = true;
    stream_ << std::endl;
    stream_ << std::string(indent_, ' ');
    stream_ << "; Debug Information" << std::endl;
  }
  if (comment_ && !inserted_type_space && spvOpcodeGeneratesType(opcode)) {
    inserted_type_space = true;
    stream_ << std::endl;
    stream_ << std::string(indent_, ' ');
    stream_ << "; Types, variables and constants" << std::endl;
  }
}